

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O1

int main(int param_1,char **param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  undefined1 uVar6;
  FILE *pFVar7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long *plVar14;
  pointer pcVar15;
  byte bVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<unsigned_long> __l_23;
  string s2;
  string s3;
  string s4;
  string s1;
  string s5;
  string expected_formatted_input;
  size_t offset_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets_1;
  string formatted_input;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected_offsets;
  string local_238;
  undefined1 local_218 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  unsigned_long local_b0;
  void *local_a8;
  iterator iStack_a0;
  unsigned_long *local_98;
  string local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  string local_50;
  
  bVar16 = 0;
  fwrite("-- starts_with\n",0xf,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  paVar13 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"abc","");
  bVar3 = phosg::starts_with((string *)&local_1d8,&local_f0);
  phosg::expect_generic
            (bVar3,"!(starts_with(\"abcdef\", \"abc\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar13) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_f0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"abcdef","");
  bVar3 = phosg::starts_with((string *)&local_1d8,&local_f0);
  phosg::expect_generic
            (bVar3,"!(starts_with(\"abcdef\", \"abcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1b9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar13) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_f0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"abcdefg","");
  bVar3 = phosg::starts_with((string *)&local_1d8,&local_f0);
  phosg::expect_generic
            (!bVar3,"!(!starts_with(\"abcdef\", \"abcdefg\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ba);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar13) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_f0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"abd","");
  bVar3 = phosg::starts_with((string *)&local_1d8,&local_f0);
  phosg::expect_generic
            (!bVar3,"!(!starts_with(\"abcdef\", \"abd\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar13) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_f0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"dbc","");
  bVar3 = phosg::starts_with((string *)&local_1d8,&local_f0);
  phosg::expect_generic
            (!bVar3,"!(!starts_with(\"abcdef\", \"dbc\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bc);
  main_cold_1();
  fwrite("-- ends_with\n",0xd,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  paVar13 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"def","");
  bVar3 = phosg::ends_with((string *)&local_1d8,&local_110);
  phosg::expect_generic
            (bVar3,"!(ends_with(\"abcdef\", \"def\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar13) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_110._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"abcdef","");
  bVar3 = phosg::ends_with((string *)&local_1d8,&local_110);
  phosg::expect_generic
            (bVar3,"!(ends_with(\"abcdef\", \"abcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar13) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_110._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"gabcdef","");
  bVar3 = phosg::ends_with((string *)&local_1d8,&local_110);
  phosg::expect_generic
            (!bVar3,"!(!ends_with(\"abcdef\", \"gabcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar13) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_110._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ded","");
  bVar3 = phosg::ends_with((string *)&local_1d8,&local_110);
  phosg::expect_generic
            (!bVar3,"!(!ends_with(\"abcdef\", \"ded\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar13) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  local_110._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"fef","");
  bVar3 = phosg::ends_with((string *)&local_1d8,&local_110);
  phosg::expect_generic
            (!bVar3,"!(!ends_with(\"abcdef\", \"fef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c3);
  main_cold_2();
  fwrite("-- str_replace_all\n",0x13,1,_stderr);
  paVar13 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"def","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"\"\" != str_replace_all(string(\"\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"abcdef","");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"efg","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"\"abcdef\" != str_replace_all(string(\"abcdef\"), \"efg\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"abcdef","");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"def","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcxyz");
  phosg::expect_generic
            (iVar4 == 0,"\"abcxyz\" != str_replace_all(string(\"abcdef\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"abcdefabc","");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"def","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcxyzabc");
  phosg::expect_generic
            (iVar4 == 0,"\"abcxyzabc\" != str_replace_all(string(\"abcdefabc\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ca);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"abcdefabcdef","");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"def","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcxyzabcxyz");
  phosg::expect_generic
            (iVar4 == 0,
             "\"abcxyzabcxyz\" != str_replace_all(string(\"abcdefabcdef\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"abcdefabcdefabc","");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"def","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcxyzabcxyzabc");
  phosg::expect_generic
            (iVar4 == 0,
             "\"abcxyzabcxyzabc\" != str_replace_all(string(\"abcdefabcdefabc\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"defabcdefabcdefabc","");
  phosg::str_replace_all((string *)&local_1d8,&local_238,"def","xyz");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"xyzabcxyzabcxyzabc");
  phosg::expect_generic
            (iVar4 == 0,
             "\"xyzabcxyzabcxyzabc\" != str_replace_all(string(\"defabcdefabcdefabc\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cd);
  main_cold_3();
  fwrite("-- strip_trailing_zeroes\n",0x19,1,_stderr);
  local_1d8._8_8_ = 6;
  local_1c8._M_allocated_capacity._0_7_ = 0x666564636261;
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s1 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1d4);
  local_238._M_string_length = 7;
  local_238.field_2._M_allocated_capacity = 0x666564636261;
  local_238._M_dataplus._M_p = (pointer)paVar13;
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&local_238);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_238,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s2 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1d7);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_218 + 0x10);
  local_218._16_7_ = 0x666564636261;
  local_218._23_4_ = 0;
  local_218._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb;
  local_218[0x1b] = '\0';
  local_218._0_8_ = pbVar1;
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     "abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s3 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1da);
  local_1f8._8_8_ = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1f8._M_allocated_capacity = (size_type)&local_1e8;
  phosg::strip_trailing_zeroes<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"s4 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1dd);
  paVar2 = &local_130.field_2;
  local_130.field_2._M_allocated_capacity._0_4_ = 0;
  local_130.field_2._M_allocated_capacity._4_2_ = 0;
  local_130._M_string_length = 5;
  local_130._M_dataplus._M_p = (pointer)paVar2;
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&local_130);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_130,"");
  phosg::expect_generic
            (iVar4 == 0,"s5 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_130.field_2._M_allocated_capacity._4_2_,
                                      local_130.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_218._0_8_,CONCAT17(local_218[0x17],local_218._16_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  fwrite("-- strip_trailing_whitespace\n",0x1d,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s1 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1e7);
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"abcdef\r\n","");
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&local_238);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_238,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s2 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ea);
  local_218._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"abc\tdef  \r\n","");
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     "abc\tdef");
  phosg::expect_generic
            (iVar4 == 0,"s3 != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ed);
  local_1f8._M_allocated_capacity = (size_type)&local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  phosg::strip_trailing_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"s4 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1f0);
  local_130._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"   \t\r\n  ","");
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&local_130);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_130,"");
  phosg::expect_generic
            (iVar4 == 0,"s5 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,499);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_130.field_2._M_allocated_capacity._4_2_,
                                      local_130.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_218._0_8_,CONCAT17(local_218[0x17],local_218._16_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  fwrite("-- strip_whitespace\n",0x14,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abcdef","");
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1fb);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"abcdef\r\n",8);
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcdef");
  phosg::expect_generic
            (iVar4 == 0,"s != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"  \nabc\tdef",10);
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abc\tdef");
  phosg::expect_generic
            (iVar4 == 0,"s != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x203);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"  \nabc\tdef  \r\n",0xe);
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abc\tdef");
  phosg::expect_generic
            (iVar4 == 0,"s != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x207);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"",0);
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"s != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x20b);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"   \t\r\n  ",8);
  phosg::strip_whitespace<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"s != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x20f);
  main_cold_4();
  fwrite("-- strip_multiline_comments\n",0x1c,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"abc/*def*/ghi","");
  phosg::strip_multiline_comments<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,false);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abcghi");
  phosg::expect_generic
            (iVar4 == 0,"s != \"abcghi\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x217);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"/*abc*/def\r\n",0xc);
  phosg::strip_multiline_comments<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,false);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"def\r\n");
  phosg::expect_generic
            (iVar4 == 0,"s != \"def\\r\\n\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x21b);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,0,
             local_1d8._8_8_,"abc\n/*def\nghi*/\njkl",0x13);
  phosg::strip_multiline_comments<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,false);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"abc\n\n\njkl");
  phosg::expect_generic
            (iVar4 == 0,"s != \"abc\\n\\n\\njkl\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x21f);
  main_cold_5();
  fwrite("-- string_printf\n",0x11,1,_stderr);
  phosg::string_printf_abi_cxx11_((string *)&local_1d8,"%s %lu 0x%04hX","lolz",1000,0x4f);
  fprintf(_stderr,"%s\n",local_1d8._M_allocated_capacity);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"lolz 1000 0x004F");
  phosg::expect_generic
            (iVar4 == 0,"\"lolz 1000 0x004F\" != result",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x227);
  main_cold_6();
  fwrite("-- split\n",9,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  plVar11 = local_1a8;
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34","");
  plVar10 = local_188;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"567","");
  plVar14 = local_168;
  local_178[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"abc","");
  __l._M_len = 4;
  __l._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,34,567,abc","");
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split(\"12,34,567,abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x80;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34","");
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"567","");
  plVar14 = local_168;
  local_178[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
  plVar9 = local_148;
  local_158[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_00,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,34,567,,","");
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34\", \"567\", \"\", \"\"}) != split(\"12,34,567,,\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0xa0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_01,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"vector<string>({\"\"}) != split(\"\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"a","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"b","");
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"c d e f","");
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_02,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a b c d e f","");
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1f8,&local_238,' ',2);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"vector<string>({\"a\", \"b\", \"c d e f\"}) != split(\"a b c d e f\", \' \', 2)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  fwrite("-- split_context\n",0x11,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34","");
  plVar10 = local_188;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"567","");
  local_178[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"abc","");
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_03,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,34,567,abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split_context(\"12,34,567,abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x234);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x80;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34","");
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"567","");
  plVar14 = local_168;
  local_178[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
  plVar9 = local_148;
  local_158[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_04,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,34,567,,","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34\", \"567\", \"\", \"\"}) != split_context(\"12,34,567,,\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x235);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0xa0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_05,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"vector<string>({\"\"}) != split_context(\"\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x236);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"a","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"b","");
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"c d e f","");
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_06,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a b c d e f","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,' ',2);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"a\", \"b\", \"c d e f\"}) != split_context(\"a b c d e f\", \' \', 2)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x237);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"3(4,56)7","");
  plVar10 = local_188;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"ab[c,]d","");
  local_178[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"e{fg(h,),}","");
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_07,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"12,3(4,56)7,ab[c,]d,e{fg(h,),}","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"3(4,56)7\", \"ab[c,]d\", \"e{fg(h,),}\"}) != split_context(\"12,3(4,56)7,ab[c,]d,e{fg(h,),}\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x239);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x80;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"(34,567)","");
  paVar13 = &local_238.field_2;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_08,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,(34,567),abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"(34,567)\", \"abc\"}) != split_context(\"12,(34,567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12(,(34),567)","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"abc","");
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_09,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12(,(34),567),abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12(,(34),567)\", \"abc\"}) != split_context(\"12(,(34),567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar13) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x40;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  plVar11 = local_1a8;
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"(,567)","");
  plVar10 = local_188;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_10,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,(,567),abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"(,567)\", \"abc\"}) != split_context(\"12,(,567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"(34,)","");
  plVar10 = local_188;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_11,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,(34,),abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"(34,)\", \"abc\"}) != split_context(\"12,(34,),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"(,)","");
  plVar10 = local_188;
  local_198[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_12,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,(,),abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',0);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"(,)\", \"abc\"}) != split_context(\"12,(,),abc\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"(34,567),abc","");
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_13,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12,(34,567),abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',1);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"(34,567),abc\"}) != split_context(\"12,(34,567),abc\", \',\', 1)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x40;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"(12,34)","");
  plVar11 = local_1a8;
  local_1b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"567,abc","");
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_14,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"(12,34),567,abc","");
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1f8,&local_238,',',1);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"(12,34)\", \"567,abc\"}) != split_context(\"(12,34),567,abc\", \',\', 1)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x40;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  fwrite("-- split_args\n",0xe,1,_stderr);
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity = 0;
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_218,(string *)&local_1d8);
  if (local_238._M_string_length - (long)local_238._M_dataplus._M_p ==
      local_218._8_8_ - local_218._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238._M_dataplus._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238._M_string_length,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"vector<string>() != split_args(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x245);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_238);
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity = 0;
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"      ","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_218,(string *)&local_1d8);
  if (local_238._M_string_length - (long)local_238._M_dataplus._M_p ==
      local_218._8_8_ - local_218._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238._M_dataplus._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238._M_string_length,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"vector<string>() != split_args(\"      \")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x246);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_238);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34","");
  plVar11 = local_188;
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"567","");
  plVar10 = local_168;
  local_178[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"abc","");
  __l_15._M_len = 4;
  __l_15._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_15,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12 34 567 abc","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split_args(\"12 34 567 abc\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x247);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x80;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 567","");
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_16,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12 \'34 567\' abc","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 \\\'34 567\\\' abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 567","");
  plVar11 = local_188;
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_17,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12 \"34 567\" abc","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 \\\"34 567\\\" abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x249);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 \'567","");
  plVar11 = local_188;
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_18._M_len = 3;
  __l_18._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_18,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12 \'34 \\\'567\' abc","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 \\\'567\", \"abc\"}) != split_args(\"12 \\\'34 \\\\\\\'567\\\' abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 \"567","");
  plVar11 = local_188;
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_19._M_len = 3;
  __l_19._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_19,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12 \"34 \\\"567\" abc","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 \\\"567\", \"abc\"}) != split_args(\"12 \\\"34 \\\\\\\"567\\\" abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 567","");
  plVar11 = local_188;
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_20._M_len = 3;
  __l_20._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_20,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"12 34\\ 567 abc","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 34\\\\ 567 abc\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 567","");
  plVar11 = local_188;
  local_198[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  __l_21._M_len = 3;
  __l_21._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_21,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"   12 34\\ 567 abc   ","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"   12 34\\\\ 567 abc   \")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"12","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"34 567","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"abc","");
  plVar11 = local_168;
  local_178[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178," ","");
  __l_22._M_len = 4;
  __l_22._M_array = (iterator)&local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218,__l_22,(allocator_type *)&local_130);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"   12 34\\ 567 abc  \\   ","");
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8,&local_238);
  if (local_218._8_8_ - local_218._0_8_ == local_1f8._8_8_ - local_1f8._0_8_) {
    bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8._M_allocated_capacity);
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,
             "vector<string>({\"12\", \"34 567\", \"abc\", \" \"}) != split_args(\"   12 34\\\\ 567 abc  \\\\   \")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  lVar8 = -0x80;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  fwrite("-- skip_whitespace/skip_non_whitespace\n",0x27,1,_stderr);
  sVar5 = phosg::skip_whitespace("1234",0);
  phosg::expect_generic
            (sVar5 == 0,"0 != skip_whitespace(\"1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x252);
  sVar5 = phosg::skip_whitespace("  1234",0);
  phosg::expect_generic
            (sVar5 == 2,"2 != skip_whitespace(\"  1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x253);
  sVar5 = phosg::skip_whitespace("  \t\r\n  1234",0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x254);
  sVar5 = phosg::skip_whitespace("  \t\r\n  1234",3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  1234\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x255);
  sVar5 = phosg::skip_whitespace("  \t\r\n  ",0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  \", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x256);
  sVar5 = phosg::skip_whitespace("  \t\r\n  ",3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  \", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,599);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234","");
  sVar5 = phosg::skip_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 0,"0 != skip_whitespace(string(\"1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"  1234","");
  sVar5 = phosg::skip_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 2,"2 != skip_whitespace(string(\"  1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x259);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"  \t\r\n  1234","");
  sVar5 = phosg::skip_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"  \t\r\n  1234","");
  sVar5 = phosg::skip_whitespace((string *)&local_1d8,3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  1234\"), 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"  \t\r\n  ","");
  sVar5 = phosg::skip_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  \"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"  \t\r\n  ","");
  sVar5 = phosg::skip_whitespace((string *)&local_1d8,3);
  phosg::expect_generic
            (sVar5 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  \"), 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  sVar5 = phosg::skip_non_whitespace("1234 ",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234 \", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25e);
  sVar5 = phosg::skip_non_whitespace("1234 ",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234 \", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25f);
  sVar5 = phosg::skip_non_whitespace("1234\t",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\t\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x260);
  sVar5 = phosg::skip_non_whitespace("1234\t",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\t\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x261);
  sVar5 = phosg::skip_non_whitespace("1234\r",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\r\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x262);
  sVar5 = phosg::skip_non_whitespace("1234\r",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\r\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x263);
  sVar5 = phosg::skip_non_whitespace("1234\n",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\n\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x264);
  sVar5 = phosg::skip_non_whitespace("1234\n",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\\n\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x265);
  sVar5 = phosg::skip_non_whitespace("1234",0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x266);
  sVar5 = phosg::skip_non_whitespace("1234",2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(\"1234\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x267);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234 ","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234 \"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234 ","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234 \"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x269);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234\t","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\t\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234\t","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\t\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234\r","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\r\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234\r","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\r\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234\n","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\n\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234\n","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\\n\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,0);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"1234","");
  sVar5 = phosg::skip_non_whitespace((string *)&local_1d8,2);
  phosg::expect_generic
            (sVar5 == 4,"4 != skip_non_whitespace(string(\"1234\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x271);
  main_cold_7();
  fwrite("-- skip_word\n",0xd,1,_stderr);
  psVar12 = &DAT_001270e8;
  paVar13 = &local_1d8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    paVar13->_M_allocated_capacity = *psVar12;
    psVar12 = psVar12 + (ulong)bVar16 * -2 + 1;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar13->_M_allocated_capacity + (ulong)bVar16 * -2 + 1);
  }
  __l_23._M_len = 9;
  __l_23._M_array = (iterator)&local_1d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,__l_23,(allocator_type *)&local_238);
  local_1c8._M_allocated_capacity = 0;
  local_1d8._M_allocated_capacity = 0;
  local_1d8._8_8_ = (unsigned_long *)0x0;
  local_238._M_dataplus._M_p = (pointer)0x0;
  do {
    local_238._M_dataplus._M_p =
         (pointer)phosg::skip_word("The quick brown fox jumped over the lazy dog.",
                                   local_238._M_dataplus._M_p);
    if (local_1d8._8_8_ == local_1c8._M_allocated_capacity) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_1d8._M_local_buf,
                 (iterator)local_1d8._8_8_,(unsigned_long *)&local_238);
    }
    else {
      *(pointer *)local_1d8._8_8_ = local_238._M_dataplus._M_p;
      local_1d8._8_8_ = local_1d8._8_8_ + 8;
    }
  } while (local_238._M_dataplus._M_p[0x12a3c2] != '\0');
  if ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == local_1d8._8_8_ - local_1d8._0_8_) {
    bVar3 = true;
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar4 = bcmp(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,(void *)local_1d8._M_allocated_capacity,
                   (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_offsets != offsets",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x27d);
  if ((void *)local_1d8._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_1d8._M_allocated_capacity,
                    local_1c8._M_allocated_capacity - local_1d8._0_8_);
  }
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"The quick brown fox jumped over the lazy dog.","");
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (unsigned_long *)0x0;
  local_98 = (unsigned_long *)0x0;
  local_b0 = 0;
  if (*(char *)local_1d8._M_allocated_capacity != '\0') {
    do {
      local_b0 = phosg::skip_word((string *)&local_1d8,local_b0);
      if (iStack_a0._M_current == local_98) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,iStack_a0,
                   &local_b0);
      }
      else {
        *iStack_a0._M_current = local_b0;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
    } while (*(char *)(local_1d8._M_allocated_capacity + local_b0) != '\0');
  }
  if ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == (long)iStack_a0._M_current - (long)local_a8) {
    bVar3 = true;
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar4 = bcmp(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,local_a8,
                   (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_offsets != offsets",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x287);
  main_cold_8();
  fwrite("-- parse_data_string/format_data_string with arbitrary data\n",0x3c,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "/* omit 01 02 */ 03 ?04? $ ##30 $ ##127 ?\"dark\"? ###-1 \'cold\' %-1.667 %%-2.667",""
            );
  local_218._0_8_ = (unsigned_long *)0x22;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_238,(size_type *)local_218,0);
  local_238.field_2._M_allocated_capacity = local_218._0_8_;
  local_238._M_dataplus._M_p[0x10] = 'o';
  local_238._M_dataplus._M_p[0x11] = '\0';
  local_238._M_dataplus._M_p[0x12] = 'l';
  local_238._M_dataplus._M_p[0x13] = '\0';
  local_238._M_dataplus._M_p[0x14] = 'd';
  local_238._M_dataplus._M_p[0x15] = '\0';
  local_238._M_dataplus._M_p[0x16] = 'B';
  local_238._M_dataplus._M_p[0x17] = '`';
  local_238._M_dataplus._M_p[0x18] = -0x2b;
  local_238._M_dataplus._M_p[0x19] = -0x41;
  local_238._M_dataplus._M_p[0x1a] = -0x44;
  local_238._M_dataplus._M_p[0x1b] = 't';
  local_238._M_dataplus._M_p[0x1c] = -0x6d;
  local_238._M_dataplus._M_p[0x1d] = '\x18';
  local_238._M_dataplus._M_p[0x1e] = '\x04';
  local_238._M_dataplus._M_p[0x1f] = 'V';
  local_238._M_dataplus._M_p[0] = '\x03';
  local_238._M_dataplus._M_p[1] = '\x04';
  local_238._M_dataplus._M_p[2] = '\0';
  local_238._M_dataplus._M_p[3] = '\x1e';
  local_238._M_dataplus._M_p[4] = '\x7f';
  local_238._M_dataplus._M_p[5] = '\0';
  local_238._M_dataplus._M_p[6] = 'd';
  local_238._M_dataplus._M_p[7] = 'a';
  local_238._M_dataplus._M_p[8] = 'r';
  local_238._M_dataplus._M_p[9] = 'k';
  local_238._M_dataplus._M_p[10] = -1;
  local_238._M_dataplus._M_p[0xb] = -1;
  local_238._M_dataplus._M_p[0xc] = -1;
  local_238._M_dataplus._M_p[0xd] = -1;
  local_238._M_dataplus._M_p[0xe] = 'c';
  local_238._M_dataplus._M_p[0xf] = '\0';
  local_238._M_dataplus._M_p[0x20] = '\x05';
  local_238._M_dataplus._M_p[0x21] = -0x40;
  local_238._M_string_length = local_218._0_8_;
  local_238._M_dataplus._M_p[local_218._0_8_] = '\0';
  local_1f8._M_allocated_capacity = 0x22;
  local_218._0_8_ = local_218 + 0x10;
  local_218._0_8_ =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                  &local_1f8._M_allocated_capacity,0);
  local_218._16_7_ = (undefined7)local_1f8._M_allocated_capacity;
  local_218[0x17] = (undefined1)((ulong)local_1f8._0_8_ >> 0x38);
  *(char *)(local_218._0_8_ + 0x10) = -1;
  *(char *)(local_218._0_8_ + 0x11) = -1;
  *(char *)(local_218._0_8_ + 0x12) = -1;
  *(char *)(local_218._0_8_ + 0x13) = -1;
  *(char *)(local_218._0_8_ + 0x14) = -1;
  *(char *)(local_218._0_8_ + 0x15) = -1;
  *(char *)(local_218._0_8_ + 0x16) = -1;
  *(char *)(local_218._0_8_ + 0x17) = -1;
  *(char *)(local_218._0_8_ + 0x18) = -1;
  *(char *)(local_218._0_8_ + 0x19) = -1;
  *(char *)(local_218._0_8_ + 0x1a) = -1;
  *(char *)(local_218._0_8_ + 0x1b) = -1;
  *(char *)(local_218._0_8_ + 0x1c) = -1;
  *(char *)(local_218._0_8_ + 0x1d) = -1;
  *(char *)(local_218._0_8_ + 0x1e) = -1;
  *(char *)(local_218._0_8_ + 0x1f) = -1;
  *(char *)(local_218._0_8_ + 0) = -1;
  *(char *)(local_218._0_8_ + 1) = '\0';
  *(char *)(local_218._0_8_ + 2) = -1;
  *(char *)(local_218._0_8_ + 3) = -1;
  *(char *)(local_218._0_8_ + 4) = -1;
  *(char *)(local_218._0_8_ + 5) = -1;
  *(char *)(local_218._0_8_ + 6) = '\0';
  *(char *)(local_218._0_8_ + 7) = '\0';
  *(char *)(local_218._0_8_ + 8) = '\0';
  *(char *)(local_218._0_8_ + 9) = '\0';
  *(char *)(local_218._0_8_ + 10) = -1;
  *(char *)(local_218._0_8_ + 0xb) = -1;
  *(char *)(local_218._0_8_ + 0xc) = -1;
  *(char *)(local_218._0_8_ + 0xd) = -1;
  *(char *)(local_218._0_8_ + 0xe) = -1;
  *(char *)(local_218._0_8_ + 0xf) = -1;
  *(char *)(local_218._0_8_ + 0x20) = -1;
  *(char *)(local_218._0_8_ + 0x21) = -1;
  local_218._8_8_ = local_1f8._M_allocated_capacity;
  *(char *)(local_218._0_8_ + local_1f8._M_allocated_capacity) = '\0';
  local_1f8._M_allocated_capacity = (size_type)&local_1e8;
  local_1f8._8_8_ = (unsigned_long *)0x0;
  local_1e8._M_local_buf[0] = '\0';
  phosg::parse_data_string(&local_130,(string *)&local_1d8,(string *)&local_1f8,0);
  if (local_238._M_string_length == local_130._M_string_length) {
    bVar3 = true;
    if ((pointer)local_238._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_238._M_dataplus._M_p,local_130._M_dataplus._M_p,local_238._M_string_length)
      ;
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x29a);
  if (local_218._8_8_ == local_1f8._8_8_) {
    bVar3 = true;
    if ((pointer)local_218._8_8_ != (pointer)0x0) {
      iVar4 = bcmp((void *)local_218._0_8_,(void *)local_1f8._M_allocated_capacity,local_218._8_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x29b);
  paVar13 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "03?04?001E7F00?6461726B?FFFFFFFF63006F006C0064004260D5BFBC749318045605C0","");
  phosg::format_data_string(&local_88,&local_130,(string *)&local_1f8,0);
  if (local_d0._M_string_length == local_88._M_string_length) {
    bVar3 = true;
    if ((unsigned_long *)local_d0._M_string_length != (unsigned_long *)0x0) {
      iVar4 = bcmp(local_d0._M_dataplus._M_p,local_88._M_dataplus._M_p,local_d0._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_formatted_input != formatted_input",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a0);
  phosg::parse_data_string(&local_50,(string *)&local_1d8,(string *)&local_1f8,0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_130,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_238._M_string_length == local_130._M_string_length) {
    bVar3 = true;
    if ((pointer)local_238._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_238._M_dataplus._M_p,local_130._M_dataplus._M_p,local_238._M_string_length)
      ;
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a3);
  if (local_218._8_8_ == local_1f8._8_8_) {
    bVar3 = true;
    if ((pointer)local_218._8_8_ != (pointer)0x0) {
      iVar4 = bcmp((void *)local_218._0_8_,(void *)local_1f8._M_allocated_capacity,local_218._8_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar13) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "0304001E7F006461726BFFFFFFFF63006F006C0064004260D5BFBC749318045605C0","");
  phosg::format_data_string(&local_88,&local_130,(string *)0x0,0);
  if (local_d0._M_string_length == local_88._M_string_length) {
    bVar3 = true;
    if ((unsigned_long *)local_d0._M_string_length != (unsigned_long *)0x0) {
      iVar4 = bcmp(local_d0._M_dataplus._M_p,local_88._M_dataplus._M_p,local_d0._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_formatted_input != formatted_input",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2aa);
  phosg::parse_data_string(&local_50,(string *)&local_1d8,(string *)&local_1f8,0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_130,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_238._M_string_length == local_130._M_string_length) {
    bVar3 = true;
    if ((pointer)local_238._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_238._M_dataplus._M_p,local_130._M_dataplus._M_p,local_238._M_string_length)
      ;
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  pcVar15 = local_218 + 0x10;
  phosg::expect_generic
            (bVar3,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ad);
  if (local_218._8_8_ == local_1f8._8_8_) {
    bVar3 = true;
    if ((pointer)local_218._8_8_ != (pointer)0x0) {
      iVar4 = bcmp((void *)local_218._0_8_,(void *)local_1f8._M_allocated_capacity,local_218._8_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ae);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar13) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_130.field_2._M_allocated_capacity._4_2_,
                                      local_130.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_218._0_8_ != pcVar15) {
    operator_delete((void *)local_218._0_8_,CONCAT17(local_218[0x17],local_218._16_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  fwrite("-- parse_data_string/format_data_string with printable data\n",0x3c,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "this is printable\nand it is sort of a haiku\nwith some control bytes\t\r\n","");
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "\"this is printable\\nand it is sort of a haiku\\nwith some control bytes\\t\\r\\n\"",
             "");
  local_218._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,
             "74686973206973207072696E7461626C650A616E6420697420697320736F7274206F662061206861696B750A7769746820736F6D6520636F6E74726F6C206279746573090D0A"
             ,"");
  phosg::format_data_string((string *)&local_1f8,(string *)&local_1d8,(string *)0x0,0);
  if (local_238._M_string_length == local_1f8._8_8_) {
    bVar3 = true;
    if ((pointer)local_238._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_238._M_dataplus._M_p,(void *)local_1f8._M_allocated_capacity,
                   local_238._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_formatted != formatted",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2b8);
  phosg::parse_data_string(&local_130,(string *)&local_1f8,(string *)0x0,0);
  if (local_1d8._8_8_ == local_130._M_string_length) {
    bVar3 = true;
    if ((unsigned_long *)local_1d8._8_8_ != (unsigned_long *)0x0) {
      iVar4 = bcmp((void *)local_1d8._M_allocated_capacity,local_130._M_dataplus._M_p,
                   local_1d8._8_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"input != parse_data_string(formatted)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2b9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_130.field_2._M_allocated_capacity._4_2_,
                                      local_130.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  phosg::format_data_string(&local_130,(string *)&local_1d8,(string *)0x0,1);
  if (local_218._8_8_ == local_130._M_string_length) {
    bVar3 = true;
    if ((pointer)local_218._8_8_ != (pointer)0x0) {
      iVar4 = bcmp((void *)local_218._0_8_,local_130._M_dataplus._M_p,local_218._8_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_formatted_hex != formatted_hex",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,699);
  phosg::parse_data_string(&local_d0,&local_130,(string *)0x0,0);
  if (local_1d8._8_8_ == local_d0._M_string_length) {
    bVar3 = true;
    if ((unsigned_long *)local_1d8._8_8_ != (unsigned_long *)0x0) {
      iVar4 = bcmp((void *)local_1d8._M_allocated_capacity,local_d0._M_dataplus._M_p,local_1d8._8_8_
                  );
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"input != parse_data_string(formatted_hex)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,700);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar13) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_130.field_2._M_allocated_capacity._4_2_,
                                      local_130.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_218._0_8_ != pcVar15) {
    operator_delete((void *)local_218._0_8_,CONCAT17(local_218[0x17],local_218._16_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  fwrite("-- parse_data_string/format_data_string with quotes in printable data\n",0x46,1,_stderr);
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"this string has \"some\" \'quotes\'.","");
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"\"this string has \\\"some\\\" \\\'quotes\\\'.\"","");
  phosg::format_data_string((string *)local_218,(string *)&local_1d8,(string *)0x0,0);
  if (local_238._M_string_length == local_218._8_8_) {
    bVar3 = true;
    if ((pointer)local_238._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_238._M_dataplus._M_p,(void *)local_218._0_8_,local_238._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"expected_formatted != formatted",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2c4);
  phosg::parse_data_string((string *)&local_1f8,(string *)local_218,(string *)0x0,0);
  if (local_1d8._8_8_ == local_1f8._8_8_) {
    bVar3 = true;
    if ((unsigned_long *)local_1d8._8_8_ != (unsigned_long *)0x0) {
      iVar4 = bcmp((void *)local_1d8._M_allocated_capacity,(void *)local_1f8._M_allocated_capacity,
                   local_1d8._8_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  phosg::expect_generic
            (bVar3,"input != parse_data_string(formatted)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2c5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_218._0_8_ != pcVar15) {
    operator_delete((void *)local_218._0_8_,CONCAT17(local_218[0x17],local_218._16_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  pFVar7 = _stderr;
  fwrite("-- format_size\n",0xf,1,_stderr);
  phosg::format_size_abi_cxx11_((string *)&local_1d8,(phosg *)0x0,0,SUB81(pFVar7,0));
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"0 bytes");
  uVar6 = 0xca;
  phosg::expect_generic
            (iVar4 == 0,"\"0 bytes\" != format_size(0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ca);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  phosg::format_size_abi_cxx11_((string *)&local_1d8,(phosg *)0x3e8,0,(bool)uVar6);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"1000 bytes");
  uVar6 = 0xcb;
  phosg::expect_generic
            (iVar4 == 0,"\"1000 bytes\" != format_size(1000)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  phosg::format_size_abi_cxx11_((string *)&local_1d8,(phosg *)0x600,0,(bool)uVar6);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"1.50 KB");
  uVar6 = 0xcc;
  phosg::expect_generic
            (iVar4 == 0,"\"1.50 KB\" != format_size(1536)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  phosg::format_size_abi_cxx11_((string *)&local_1d8,(phosg *)0x600,1,(bool)uVar6);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"1536 bytes (1.50 KB)");
  uVar6 = 0xcd;
  phosg::expect_generic
            (iVar4 == 0,"\"1536 bytes (1.50 KB)\" != format_size(1536, true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  phosg::format_size_abi_cxx11_((string *)&local_1d8,(phosg *)0x40000000,0,(bool)uVar6);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"1.00 GB");
  uVar6 = 0xce;
  phosg::expect_generic
            (iVar4 == 0,"\"1.00 GB\" != format_size(1073741824)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ce);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  phosg::format_size_abi_cxx11_((string *)&local_1d8,(phosg *)0x40000000,1,(bool)uVar6);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"1073741824 bytes (1.00 GB)");
  phosg::expect_generic
            (iVar4 == 0,"\"1073741824 bytes (1.00 GB)\" != format_size(1073741824, true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cf);
  main_cold_9();
  fwrite("-- parse_size\n",0xe,1,_stderr);
  sVar5 = phosg::parse_size("0");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d4);
  sVar5 = phosg::parse_size("0B");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0B\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d5);
  sVar5 = phosg::parse_size("0 B");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0 B\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d6);
  sVar5 = phosg::parse_size("0 bytes");
  phosg::expect_generic
            (sVar5 == 0,"0 != parse_size(\"0 bytes\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d7);
  sVar5 = phosg::parse_size("1000 bytes");
  phosg::expect_generic
            (sVar5 == 1000,"1000 != parse_size(\"1000 bytes\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d8);
  sVar5 = phosg::parse_size("1.5 KB");
  phosg::expect_generic
            (sVar5 == 0x600,"1536 != parse_size(\"1.5 KB\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d9);
  sVar5 = phosg::parse_size("3 MB");
  phosg::expect_generic
            (sVar5 == 0x300000,"3 * 1024 * 1024 != parse_size(\"3 MB\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2da);
  fwrite("-- escape_quotes\n",0x11,1,_stderr);
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  phosg::escape_quotes((string *)&local_1d8,&local_238);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"\"\" != escape_quotes(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2df);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"omg hax","");
  phosg::escape_quotes((string *)&local_1d8,&local_238);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"omg hax");
  phosg::expect_generic
            (iVar4 == 0,"\"omg hax\" != escape_quotes(\"omg hax\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"\'omg\' \"hax\"","");
  phosg::escape_quotes((string *)&local_1d8,&local_238);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"\'omg\' \\\"hax\\\"");
  phosg::expect_generic
            (iVar4 == 0,
             "\"\\\'omg\\\' \\\\\\\"hax\\\\\\\"\" != escape_quotes(\"\\\'omg\\\' \\\"hax\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e1);
  main_cold_10();
  fwrite("-- escape_url\n",0xe,1,_stderr);
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  phosg::escape_url((string *)&local_1d8,&local_238,false);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"");
  phosg::expect_generic
            (iVar4 == 0,"\"\" != escape_url(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"omg hax","");
  phosg::escape_url((string *)&local_1d8,&local_238,false);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"omg%20hax");
  phosg::expect_generic
            (iVar4 == 0,"\"omg%20hax\" != escape_url(\"omg hax\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"slash/es","");
  phosg::escape_url((string *)&local_1d8,&local_238,false);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"slash/es");
  phosg::expect_generic
            (iVar4 == 0,"\"slash/es\" != escape_url(\"slash/es\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"slash/es","");
  phosg::escape_url((string *)&local_1d8,&local_238,true);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                     ,"slash%2Fes");
  phosg::expect_generic
            (iVar4 == 0,"\"slash%2Fes\" != escape_url(\"slash/es\", true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_allocated_capacity != &local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  print_data_test();
  test_bit_reader();
  test_string_reader();
  unlink("StringsTest-data");
  puts("StringsTest: all tests passed");
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int, char**) {

  fprintf(stderr, "-- starts_with\n");
  expect(starts_with("abcdef", "abc"));
  expect(starts_with("abcdef", "abcdef"));
  expect(!starts_with("abcdef", "abcdefg"));
  expect(!starts_with("abcdef", "abd"));
  expect(!starts_with("abcdef", "dbc"));

  fprintf(stderr, "-- ends_with\n");
  expect(ends_with("abcdef", "def"));
  expect(ends_with("abcdef", "abcdef"));
  expect(!ends_with("abcdef", "gabcdef"));
  expect(!ends_with("abcdef", "ded"));
  expect(!ends_with("abcdef", "fef"));

  {
    fprintf(stderr, "-- str_replace_all\n");
    expect_eq("", str_replace_all(string(""), "def", "xyz"));
    expect_eq("abcdef", str_replace_all(string("abcdef"), "efg", "xyz"));
    expect_eq("abcxyz", str_replace_all(string("abcdef"), "def", "xyz"));
    expect_eq("abcxyzabc", str_replace_all(string("abcdefabc"), "def", "xyz"));
    expect_eq("abcxyzabcxyz", str_replace_all(string("abcdefabcdef"), "def", "xyz"));
    expect_eq("abcxyzabcxyzabc", str_replace_all(string("abcdefabcdefabc"), "def", "xyz"));
    expect_eq("xyzabcxyzabcxyzabc", str_replace_all(string("defabcdefabcdefabc"), "def", "xyz"));
  }

  {
    fprintf(stderr, "-- strip_trailing_zeroes\n");
    string s1("abcdef", 6);
    strip_trailing_zeroes(s1);
    expect_eq(s1, "abcdef");
    string s2("abcdef\0", 7);
    strip_trailing_zeroes(s2);
    expect_eq(s2, "abcdef");
    string s3("abcdef\0\0\0\0\0", 11);
    strip_trailing_zeroes(s3);
    expect_eq(s3, "abcdef");
    string s4("", 0);
    strip_trailing_zeroes(s4);
    expect_eq(s4, "");
    string s5("\0\0\0\0\0", 5);
    strip_trailing_zeroes(s5);
    expect_eq(s5, "");
  }

  {
    fprintf(stderr, "-- strip_trailing_whitespace\n");
    string s1 = "abcdef";
    strip_trailing_whitespace(s1);
    expect_eq(s1, "abcdef");
    string s2 = "abcdef\r\n";
    strip_trailing_whitespace(s2);
    expect_eq(s2, "abcdef");
    string s3 = "abc\tdef  \r\n";
    strip_trailing_whitespace(s3);
    expect_eq(s3, "abc\tdef");
    string s4 = "";
    strip_trailing_whitespace(s4);
    expect_eq(s4, "");
    string s5 = "   \t\r\n  ";
    strip_trailing_whitespace(s5);
    expect_eq(s5, "");
  }

  {
    fprintf(stderr, "-- strip_whitespace\n");

    string s = "abcdef";
    strip_whitespace(s);
    expect_eq(s, "abcdef");

    s = "abcdef\r\n";
    strip_whitespace(s);
    expect_eq(s, "abcdef");

    s = "  \nabc\tdef";
    strip_whitespace(s);
    expect_eq(s, "abc\tdef");

    s = "  \nabc\tdef  \r\n";
    strip_whitespace(s);
    expect_eq(s, "abc\tdef");

    s = "";
    strip_whitespace(s);
    expect_eq(s, "");

    s = "   \t\r\n  ";
    strip_whitespace(s);
    expect_eq(s, "");
  }

  {
    fprintf(stderr, "-- strip_multiline_comments\n");

    string s = "abc/*def*/ghi";
    strip_multiline_comments(s);
    expect_eq(s, "abcghi");

    s = "/*abc*/def\r\n";
    strip_multiline_comments(s);
    expect_eq(s, "def\r\n");

    s = "abc\n/*def\nghi*/\njkl";
    strip_multiline_comments(s);
    expect_eq(s, "abc\n\n\njkl");
  }

  {
    fprintf(stderr, "-- string_printf\n");
    string result = string_printf("%s %" PRIu64 " 0x%04hX", "lolz",
        static_cast<uint64_t>(1000), static_cast<uint16_t>(0x4F));
    fprintf(stderr, "%s\n", result.c_str());
    expect_eq("lolz 1000 0x004F", result);
  }

  {
    fprintf(stderr, "-- split\n");
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split("12,34,567,abc", ','));
    expect_eq(vector<string>({"12", "34", "567", "", ""}), split("12,34,567,,", ','));
    expect_eq(vector<string>({""}), split("", ','));
    expect_eq(vector<string>({"a", "b", "c d e f"}), split("a b c d e f", ' ', 2));
  }

  {
    fprintf(stderr, "-- split_context\n");
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split_context("12,34,567,abc", ','));
    expect_eq(vector<string>({"12", "34", "567", "", ""}), split_context("12,34,567,,", ','));
    expect_eq(vector<string>({""}), split_context("", ','));
    expect_eq(vector<string>({"a", "b", "c d e f"}), split_context("a b c d e f", ' ', 2));
    expect_eq(vector<string>({"12", "3(4,56)7", "ab[c,]d", "e{fg(h,),}"}),
        split_context("12,3(4,56)7,ab[c,]d,e{fg(h,),}", ','));
    expect_eq(vector<string>({"12", "(34,567)", "abc"}), split_context("12,(34,567),abc", ','));
    expect_eq(vector<string>({"12(,(34),567)", "abc"}), split_context("12(,(34),567),abc", ','));
    expect_eq(vector<string>({"12", "(,567)", "abc"}), split_context("12,(,567),abc", ','));
    expect_eq(vector<string>({"12", "(34,)", "abc"}), split_context("12,(34,),abc", ','));
    expect_eq(vector<string>({"12", "(,)", "abc"}), split_context("12,(,),abc", ','));
    expect_eq(vector<string>({"12", "(34,567),abc"}), split_context("12,(34,567),abc", ',', 1));
    expect_eq(vector<string>({"(12,34)", "567,abc"}), split_context("(12,34),567,abc", ',', 1));
  }

  {
    fprintf(stderr, "-- split_args\n");
    expect_eq(vector<string>(), split_args(""));
    expect_eq(vector<string>(), split_args("      "));
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split_args("12 34 567 abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 \'34 567\' abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 \"34 567\" abc"));
    expect_eq(vector<string>({"12", "34 \'567", "abc"}), split_args("12 \'34 \\\'567\' abc"));
    expect_eq(vector<string>({"12", "34 \"567", "abc"}), split_args("12 \"34 \\\"567\" abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 34\\ 567 abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("   12 34\\ 567 abc   "));
    expect_eq(vector<string>({"12", "34 567", "abc", " "}), split_args("   12 34\\ 567 abc  \\   "));
  }

  fprintf(stderr, "-- skip_whitespace/skip_non_whitespace\n");
  expect_eq(0, skip_whitespace("1234", 0));
  expect_eq(2, skip_whitespace("  1234", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  1234", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  1234", 3));
  expect_eq(7, skip_whitespace("  \t\r\n  ", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  ", 3));
  expect_eq(0, skip_whitespace(string("1234"), 0));
  expect_eq(2, skip_whitespace(string("  1234"), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  1234"), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  1234"), 3));
  expect_eq(7, skip_whitespace(string("  \t\r\n  "), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  "), 3));
  expect_eq(4, skip_non_whitespace("1234 ", 0));
  expect_eq(4, skip_non_whitespace("1234 ", 2));
  expect_eq(4, skip_non_whitespace("1234\t", 0));
  expect_eq(4, skip_non_whitespace("1234\t", 2));
  expect_eq(4, skip_non_whitespace("1234\r", 0));
  expect_eq(4, skip_non_whitespace("1234\r", 2));
  expect_eq(4, skip_non_whitespace("1234\n", 0));
  expect_eq(4, skip_non_whitespace("1234\n", 2));
  expect_eq(4, skip_non_whitespace("1234", 0));
  expect_eq(4, skip_non_whitespace("1234", 2));
  expect_eq(4, skip_non_whitespace(string("1234 "), 0));
  expect_eq(4, skip_non_whitespace(string("1234 "), 2));
  expect_eq(4, skip_non_whitespace(string("1234\t"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\t"), 2));
  expect_eq(4, skip_non_whitespace(string("1234\r"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\r"), 2));
  expect_eq(4, skip_non_whitespace(string("1234\n"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\n"), 2));
  expect_eq(4, skip_non_whitespace(string("1234"), 0));
  expect_eq(4, skip_non_whitespace(string("1234"), 2));

  fprintf(stderr, "-- skip_word\n");
  const char* sentence = "The quick brown fox jumped over the lazy dog.";
  vector<size_t> expected_offsets = {4, 10, 16, 20, 27, 32, 36, 41, 45};
  {
    vector<size_t> offsets;
    size_t offset = 0;
    while (sentence[offset]) {
      offset = skip_word(sentence, offset);
      offsets.emplace_back(offset);
    }
    expect_eq(expected_offsets, offsets);
  }
  {
    string sentence_str(sentence);
    vector<size_t> offsets;
    size_t offset = 0;
    while (sentence_str[offset]) {
      offset = skip_word(sentence_str, offset);
      offsets.emplace_back(offset);
    }
    expect_eq(expected_offsets, offsets);
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with arbitrary data\n");
  {
    string input("/* omit 01 02 */ 03 ?04? $ ##30 $ ##127 ?\"dark\"? ###-1 \'cold\' %-1.667 %%-2.667");
    string expected_data(
        "\x03\x04" // 03 ?04?
        "\x00\x1E" // $ ##30 $
        "\x7F\x00" // ##127
        "\x64\x61\x72\x6B" // ?"dark"?
        "\xFF\xFF\xFF\xFF" // ###-1
        "\x63\x00\x6F\x00\x6C\x00\x64\x00" // 'cold'
        "\x42\x60\xD5\xBF" // %-1.667
        "\xBC\x74\x93\x18\x04\x56\x05\xC0", // %%-2.667
        34);
    string expected_mask("\xFF\x00\xFF\xFF\xFF\xFF\x00\x00\x00\x00\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF", 34);
    string output_mask;
    string output_data = parse_data_string(input, &output_mask);
    expect_eq(expected_data, output_data);
    expect_eq(expected_mask, output_mask);

    {
      string expected_formatted_input("03?04?001E7F00?6461726B?FFFFFFFF63006F006C0064004260D5BFBC749318045605C0");
      string formatted_input = format_data_string(output_data, &output_mask);
      expect_eq(expected_formatted_input, formatted_input);

      output_data = parse_data_string(input, &output_mask);
      expect_eq(expected_data, output_data);
      expect_eq(expected_mask, output_mask);
    }

    {
      string expected_formatted_input("0304001E7F006461726BFFFFFFFF63006F006C0064004260D5BFBC749318045605C0");
      string formatted_input = format_data_string(output_data, nullptr);
      expect_eq(expected_formatted_input, formatted_input);

      output_data = parse_data_string(input, &output_mask);
      expect_eq(expected_data, output_data);
      expect_eq(expected_mask, output_mask);
    }
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with printable data\n");
  {
    string input("this is printable\nand it is sort of a haiku\nwith some control bytes\t\r\n");
    string expected_formatted("\"this is printable\\nand it is sort of a haiku\\nwith some control bytes\\t\\r\\n\"");
    string expected_formatted_hex("74686973206973207072696E7461626C650A616E6420697420697320736F7274206F662061206861696B750A7769746820736F6D6520636F6E74726F6C206279746573090D0A");
    string formatted = format_data_string(input);
    expect_eq(expected_formatted, formatted);
    expect_eq(input, parse_data_string(formatted));
    string formatted_hex = format_data_string(input, nullptr, FormatDataFlags::HEX_ONLY);
    expect_eq(expected_formatted_hex, formatted_hex);
    expect_eq(input, parse_data_string(formatted_hex));
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with quotes in printable data\n");
  {
    string input("this string has \"some\" \'quotes\'.");
    string expected_formatted("\"this string has \\\"some\\\" \\\'quotes\\\'.\"");
    string formatted = format_data_string(input);
    expect_eq(expected_formatted, formatted);
    expect_eq(input, parse_data_string(formatted));
  }

  fprintf(stderr, "-- format_size\n");
  {
    expect_eq("0 bytes", format_size(0));
    expect_eq("1000 bytes", format_size(1000));
    expect_eq("1.50 KB", format_size(1536));
    expect_eq("1536 bytes (1.50 KB)", format_size(1536, true));
    expect_eq("1.00 GB", format_size(1073741824));
    expect_eq("1073741824 bytes (1.00 GB)", format_size(1073741824, true));
  }

  fprintf(stderr, "-- parse_size\n");
  {
    expect_eq(0, parse_size("0"));
    expect_eq(0, parse_size("0B"));
    expect_eq(0, parse_size("0 B"));
    expect_eq(0, parse_size("0 bytes"));
    expect_eq(1000, parse_size("1000 bytes"));
    expect_eq(1536, parse_size("1.5 KB"));
    expect_eq(3 * 1024 * 1024, parse_size("3 MB"));
  }

  fprintf(stderr, "-- escape_quotes\n");
  {
    expect_eq("", escape_quotes(""));
    expect_eq("omg hax", escape_quotes("omg hax"));
    expect_eq("\'omg\' \\\"hax\\\"", escape_quotes("\'omg\' \"hax\""));
  }

  fprintf(stderr, "-- escape_url\n");
  {
    expect_eq("", escape_url(""));
    expect_eq("omg%20hax", escape_url("omg hax"));
    expect_eq("slash/es", escape_url("slash/es"));
    expect_eq("slash%2Fes", escape_url("slash/es", true));
  }

  print_data_test();

  test_bit_reader();

  test_string_reader();

  // TODO: test string_vprintf
  // TODO: test log_level, set_log_level, log
  // TODO: test get_time_string
  // TODO: test string_for_error

  unlink("StringsTest-data");

  printf("StringsTest: all tests passed\n");
  return 0;
}